

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O2

void __thiscall
chrono::ChArchiveAsciiDump::out(ChArchiveAsciiDump *this,ChValue *bVal,bool tracked,size_t obj_ID)

{
  undefined1 *puVar1;
  int iVar2;
  ChStreamOutAscii *pCVar3;
  undefined4 extraout_var;
  
  indent(this);
  if (this->suppress_names == false) {
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(this->ostream,(bVal->_name)._M_dataplus._M_p);
    chrono::ChStreamOutAscii::operator<<(pCVar3,"  ");
  }
  pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream,"[");
  iVar2 = (*bVal->_vptr_ChValue[5])(bVal);
  pCVar3 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar3,(char *)CONCAT44(extraout_var,iVar2));
  chrono::ChStreamOutAscii::operator<<(pCVar3,"]");
  if (tracked) {
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(this->ostream," (tracked)   ID= ");
    chrono::ChStreamOutAscii::operator<<(pCVar3,obj_ID);
  }
  if ((this->super_ChArchiveOut).super_ChArchive.use_versions == true) {
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(this->ostream," version=");
    iVar2 = (*bVal->_vptr_ChValue[4])(bVal);
    chrono::ChStreamOutAscii::operator<<(pCVar3,iVar2);
  }
  chrono::ChStreamOutAscii::operator<<(this->ostream," \n");
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  (*bVal->_vptr_ChValue[0xd])(bVal,this);
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  return;
}

Assistant:

virtual void out     (ChValue& bVal, bool tracked, size_t obj_ID) {
            indent();
            if (!suppress_names) 
                (*ostream) << bVal.name() << "  "; 
            (*ostream) << "[" << bVal.GetTypeidName() << "]";
            if (tracked)
                (*ostream) << " (tracked)   ID= " << obj_ID; 
            if (this->use_versions)
                (*ostream) << " version=" << bVal.GetClassRegisteredVersion();
            (*ostream) << " \n";
            ++tablevel;
            bVal.CallArchiveOut(*this);
            --tablevel;
      }